

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O1

void exchange_bytes(void *a,void *b,size_t size)

{
  undefined1 uVar1;
  size_t sVar2;
  uint8_t *bp;
  uint8_t *ap;
  
  if (size != 0) {
    sVar2 = 0;
    do {
      uVar1 = *(undefined1 *)((long)a + sVar2);
      *(undefined1 *)((long)a + sVar2) = *(undefined1 *)((long)b + sVar2);
      *(undefined1 *)((long)b + sVar2) = uVar1;
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  return;
}

Assistant:

static void exchange_bytes(void *a, void *b, size_t size) {
    uint8_t *ap = (uint8_t *)a;
    uint8_t *bp = (uint8_t *)b;

    while (size-- != 0) {
        uint8_t t = *ap;
        *ap++ = *bp;
        *bp++ = t;
    }
}